

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O3

int32_t uloc_getDisplayName_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UChar *pUVar4;
  UChar *pUVar5;
  ulong uVar6;
  UChar *pUVar7;
  undefined4 extraout_var;
  UEnumeration *en;
  char *keyword;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  UChar UVar12;
  UErrorCode UVar13;
  UChar UVar14;
  uint uVar15;
  UChar UVar16;
  UErrorCode UVar17;
  UErrorCode destCapacity_00;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  UErrorCode status;
  int32_t patLen;
  int32_t sepLen;
  UChar local_cc;
  UChar local_ca;
  UErrorCode local_b8;
  int local_b4;
  uint local_b0;
  uint local_ac;
  char *local_a8;
  uint local_9c;
  UChar *local_98;
  UChar *local_90;
  char *local_88;
  uint local_7c;
  uint local_78;
  int local_74;
  UChar *local_70;
  UChar *local_68;
  UChar *local_60;
  uint local_54;
  UChar *local_50;
  UEnumeration *local_48;
  UChar *local_40;
  char *local_38;
  UChar *pUVar11;
  
  local_ac = 0;
  local_b0 = 0;
  iVar2 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar2 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0) || (dest == (UChar *)0x0 && destCapacity != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_b8 = U_ZERO_ERROR;
      local_a8 = displayLocale;
      local_88 = locale;
      resB = ures_open_63("icudt63l-lang",displayLocale,&local_b8);
      iVar2 = 0;
      resB_00 = ures_getByKeyWithFallback_63
                          (resB,"localeDisplayPattern",(UResourceBundle *)0x0,&local_b8);
      pUVar4 = ures_getStringByKeyWithFallback_63
                         (resB_00,"separator",(int32_t *)&local_ac,&local_b8);
      local_70 = ures_getStringByKeyWithFallback_63
                           (resB_00,"pattern",(int32_t *)&local_b0,&local_b8);
      ures_close_63(resB_00);
      ures_close_63(resB);
      pUVar7 = L"{0}, {1}";
      if (local_ac != 0) {
        pUVar7 = pUVar4;
      }
      pUVar4 = u_strstr_63(pUVar7,L"{0}");
      pUVar5 = u_strstr_63(pUVar7,L"{1}");
      pUVar7 = local_70;
      if (pUVar5 < pUVar4 || (pUVar5 == (UChar *)0x0 || pUVar4 == (UChar *)0x0)) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        local_90 = pUVar4 + 3;
        local_ac = (uint)((ulong)((long)pUVar5 - (long)local_90) >> 1);
        if ((local_b0 == 0) ||
           ((local_b0 == 9 && (iVar2 = u_strncmp_63(local_70,L"{0} ({1})",9), iVar2 == 0)))) {
          local_b0 = 9;
          local_70 = L"{0} ({1})";
          bVar9 = false;
          local_78 = 5;
          UVar12 = L'(';
          UVar16 = L'[';
          local_ca = L')';
          local_cc = L']';
          local_68 = (UChar *)0x0;
        }
        else {
          pUVar4 = u_strstr_63(pUVar7,L"{0}");
          pUVar5 = u_strstr_63(pUVar7,L"{1}");
          if (pUVar5 == (UChar *)0x0 || pUVar4 == (UChar *)0x0) {
            *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
          }
          uVar19 = (ulong)((long)pUVar4 - (long)pUVar7) >> 1;
          uVar6 = (ulong)((long)pUVar5 - (long)pUVar7) >> 1;
          uVar15 = (uint)uVar6;
          uVar18 = (uint)uVar19;
          bVar9 = (int)uVar15 < (int)uVar18;
          local_78 = uVar18;
          if ((int)uVar18 < (int)uVar15) {
            local_78 = uVar15;
          }
          if ((int)uVar15 < (int)uVar18) {
            uVar19 = uVar6;
          }
          pUVar7 = u_strchr_63(pUVar7,L'（');
          local_68 = (UChar *)(uVar19 & 0xffffffff);
          if (pUVar7 == (UChar *)0x0) {
            UVar12 = L'(';
            UVar16 = L'[';
            local_ca = L')';
            local_cc = L']';
          }
          else {
            UVar12 = L'（';
            UVar16 = L'［';
            local_ca = L'）';
            local_cc = L'］';
          }
        }
        local_54 = (uint)bVar9;
        bVar1 = true;
        pUVar7 = (UChar *)0x0;
        bVar9 = true;
        do {
          pUVar5 = (UChar *)((ulong)local_68 & 0xffffffff);
          iVar3 = (int)local_68;
          pUVar11 = (UChar *)0x0;
          pUVar4 = dest;
          if (((iVar3 != 0) && (pUVar11 = pUVar5, iVar3 <= destCapacity)) &&
             (pUVar11 = (UChar *)0x0, 0 < iVar3)) {
            lVar20 = 0;
            do {
              *(undefined2 *)((long)dest + lVar20) = *(undefined2 *)((long)local_70 + lVar20);
              lVar20 = lVar20 + 2;
            } while ((long)pUVar5 * 2 != lVar20);
            pUVar4 = (UChar *)(lVar20 + (long)dest);
            pUVar11 = pUVar5;
          }
          local_60 = (UChar *)0x0;
          uVar15 = 0;
          local_48 = (UEnumeration *)0x0;
          local_b4 = 0;
          local_7c = 0;
          local_74 = 0;
          local_40 = (UChar *)0x0;
          local_68 = pUVar5;
          local_50 = pUVar7;
          do {
            iVar3 = (int)pUVar5;
            UVar17 = destCapacity - iVar3;
            if (U_ZERO_ERROR < UVar17) {
              pUVar4 = dest + iVar3;
            }
            pUVar7 = (UChar *)0x0;
            destCapacity_00 = UVar17;
            if (UVar17 < U_ILLEGAL_ARGUMENT_ERROR) {
              destCapacity_00 = U_ZERO_ERROR;
            }
            if (uVar15 == local_54) {
              if (!bVar9) {
                bVar9 = false;
                goto LAB_002811a3;
              }
              iVar2 = uloc_getDisplayLanguage_63
                                (local_88,local_a8,pUVar4,destCapacity_00,pErrorCode);
              pUVar7 = (UChar *)CONCAT44(extraout_var,iVar2);
              bVar9 = 0 < iVar2;
              bVar21 = false;
              pUVar5 = (UChar *)(ulong)(uint)(iVar2 + iVar3);
              local_74 = iVar3;
              local_40 = pUVar7;
              goto LAB_0028142d;
            }
            if (!bVar1) {
              bVar1 = false;
LAB_002811a3:
              bVar21 = false;
              goto LAB_0028142d;
            }
            en = local_48;
            local_9c = uVar15;
            switch((ulong)local_60 & 0xffffffff) {
            case 0:
              uVar15 = uloc_getDisplayScriptInContext_63
                                 (local_88,local_a8,pUVar4,destCapacity_00,pErrorCode);
              local_b4 = iVar3;
              break;
            case 1:
              uVar15 = uloc_getDisplayCountry_63
                                 (local_88,local_a8,pUVar4,destCapacity_00,pErrorCode);
              break;
            case 2:
              uVar15 = uloc_getDisplayVariant_63
                                 (local_88,local_a8,pUVar4,destCapacity_00,pErrorCode);
              break;
            case 3:
              local_98 = pUVar5;
              en = uloc_openKeywords_63(local_88,pErrorCode);
              pUVar5 = local_98;
            default:
              local_98 = pUVar5;
              keyword = uenum_next_63(en,&local_b8,pErrorCode);
              bVar21 = keyword != (char *)0x0;
              local_48 = en;
              if (bVar21) {
                local_38 = keyword;
                local_b8 = uloc_getDisplayKeyword_63
                                     (keyword,local_a8,pUVar4,destCapacity_00,pErrorCode);
                pUVar5 = local_98;
                if (local_b8 == U_ZERO_ERROR) {
                  local_b8 = U_ZERO_ERROR;
                  UVar13 = destCapacity_00;
                }
                else {
                  if (local_b8 < destCapacity_00) {
                    pUVar4[local_b8] = L'=';
                  }
                  local_b8 = local_b8 + U_ILLEGAL_ARGUMENT_ERROR;
                  if (destCapacity_00 - local_b8 == U_ZERO_ERROR || destCapacity_00 < local_b8) {
                    UVar13 = U_ZERO_ERROR;
                  }
                  else {
                    pUVar4 = pUVar4 + local_b8;
                    UVar13 = destCapacity_00 - local_b8;
                  }
                }
                if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                  *pErrorCode = U_ZERO_ERROR;
                }
                local_98 = (UChar *)CONCAT44(local_98._4_4_,UVar13);
                iVar2 = uloc_getDisplayKeywordValue_63
                                  (local_88,local_38,local_a8,pUVar4,UVar13,pErrorCode);
                if (local_b8 == U_ZERO_ERROR) {
                  UVar13 = U_ZERO_ERROR;
                  destCapacity_00 = (UErrorCode)local_98;
                }
                else {
                  if (iVar2 == 0) {
                    local_b8 = local_b8 + ~U_ZERO_ERROR;
                  }
                  UVar13 = local_b8;
                  if (U_ZERO_ERROR < UVar17) {
                    pUVar4 = dest + iVar3;
                  }
                }
                uVar15 = UVar13 + iVar2;
                goto LAB_00281358;
              }
              uenum_close_63(en);
              uVar19 = 0;
              pUVar5 = local_98;
              goto LAB_00281363;
            }
            bVar21 = true;
LAB_00281358:
            uVar19 = (ulong)uVar15;
LAB_00281363:
            iVar3 = (int)pUVar5;
            if ((int)uVar19 < 1) {
              if (bVar21) goto LAB_00281411;
              uVar15 = 0;
              if (iVar3 != local_b4) {
                uVar15 = local_ac;
              }
              uVar15 = iVar3 - uVar15;
              pUVar5 = (UChar *)(ulong)uVar15;
              local_7c = uVar15 - local_b4;
              bVar1 = local_7c != 0 && local_b4 <= (int)uVar15;
            }
            else {
              UVar17 = local_ac + (int)uVar19;
              if (UVar17 <= destCapacity_00) {
                pUVar7 = pUVar4 + uVar19;
                do {
                  UVar14 = UVar16;
                  if ((*pUVar4 == UVar12) || (UVar14 = local_cc, *pUVar4 == local_ca)) {
                    *pUVar4 = UVar14;
                  }
                  pUVar4 = pUVar4 + 1;
                } while (pUVar4 < pUVar7);
                if (0 < (int)local_ac) {
                  lVar20 = 0;
                  do {
                    *(undefined2 *)((long)pUVar4 + lVar20) =
                         *(undefined2 *)((long)local_90 + lVar20);
                    lVar20 = lVar20 + 2;
                  } while ((ulong)local_ac * 2 != lVar20);
                  pUVar4 = (UChar *)((long)pUVar4 + lVar20);
                }
              }
              pUVar5 = (UChar *)(ulong)(uint)(iVar3 + UVar17);
LAB_00281411:
              bVar1 = true;
            }
            pUVar7 = (UChar *)(ulong)((int)local_60 + 1);
            uVar15 = local_9c;
            local_60 = pUVar7;
LAB_0028142d:
            if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
              *pErrorCode = U_ZERO_ERROR;
            }
            if (!bVar21) {
              iVar3 = (int)pUVar5;
              if ((bVar9) && (bVar1)) {
                uVar18 = local_78;
                if (uVar15 != 0) {
                  uVar18 = local_b0;
                }
                pUVar7 = (UChar *)(ulong)uVar18;
                uVar10 = (int)pUVar11 + 3;
                pUVar11 = (UChar *)(ulong)uVar10;
                uVar8 = (uVar18 - uVar10) + iVar3;
                if ((int)uVar8 < destCapacity) {
                  pUVar4 = dest + iVar3;
                  if (0 < (int)(uVar18 - uVar10)) {
                    pUVar5 = local_70 + (int)uVar10;
                    do {
                      *pUVar4 = *pUVar5;
                      pUVar4 = pUVar4 + 1;
                      pUVar5 = pUVar5 + 1;
                      uVar10 = (int)pUVar11 + 1;
                      pUVar11 = (UChar *)(ulong)uVar10;
                    } while (uVar18 != uVar10);
                  }
                  pUVar5 = (UChar *)(ulong)uVar8;
                }
                else {
                  pUVar5 = (UChar *)(ulong)uVar8;
                  pUVar11 = pUVar7;
                }
              }
              else if (uVar15 == 0) {
                local_68 = (UChar *)0x0;
                pUVar5 = (UChar *)0x0;
              }
              else if (0 < iVar3) {
                uVar18 = local_7c;
                if (bVar9) {
                  uVar18 = (uint)local_40;
                }
                pUVar5 = (UChar *)(ulong)uVar18;
                pUVar7 = (UChar *)(ulong)local_7c;
                if ((dest != (UChar *)0x0) && (pUVar7 = local_68, (int)local_68 != 0)) {
                  iVar3 = (int)local_68 + uVar18;
                  if (destCapacity < iVar3) {
                    pUVar7 = (UChar *)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
                    local_68 = (UChar *)0x0;
                    local_50 = pUVar7;
                  }
                  else {
                    iVar3 = local_b4;
                    if (bVar9) {
                      iVar3 = local_74;
                    }
                    pUVar7 = u_memmove_63(dest,dest + iVar3,uVar18);
                  }
                }
              }
              uVar15 = uVar15 + 1;
            }
          } while ((int)uVar15 < 2);
          pUVar7 = (UChar *)CONCAT71((int7)((ulong)pUVar7 >> 8),1);
        } while ((char)local_50 != '\0');
        iVar2 = u_terminateUChars_63(dest,destCapacity,(int32_t)pUVar5,pErrorCode);
      }
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayName(const char *locale,
                    const char *displayLocale,
                    UChar *dest, int32_t destCapacity,
                    UErrorCode *pErrorCode)
{
    static const UChar defaultSeparator[9] = { 0x007b, 0x0030, 0x007d, 0x002c, 0x0020, 0x007b, 0x0031, 0x007d, 0x0000 }; /* "{0}, {1}" */
    static const UChar sub0[4] = { 0x007b, 0x0030, 0x007d , 0x0000 } ; /* {0} */
    static const UChar sub1[4] = { 0x007b, 0x0031, 0x007d , 0x0000 } ; /* {1} */
    static const int32_t subLen = 3;
    static const UChar defaultPattern[10] = {
        0x007b, 0x0030, 0x007d, 0x0020, 0x0028, 0x007b, 0x0031, 0x007d, 0x0029, 0x0000
    }; /* {0} ({1}) */
    static const int32_t defaultPatLen = 9;
    static const int32_t defaultSub0Pos = 0;
    static const int32_t defaultSub1Pos = 5;

    int32_t length; /* of formatted result */

    const UChar *separator;
    int32_t sepLen = 0;
    const UChar *pattern;
    int32_t patLen = 0;
    int32_t sub0Pos, sub1Pos;
    
    UChar formatOpenParen         = 0x0028; // (
    UChar formatReplaceOpenParen  = 0x005B; // [
    UChar formatCloseParen        = 0x0029; // )
    UChar formatReplaceCloseParen = 0x005D; // ]

    UBool haveLang = TRUE; /* assume true, set false if we find we don't have
                              a lang component in the locale */
    UBool haveRest = TRUE; /* assume true, set false if we find we don't have
                              any other component in the locale */
    UBool retry = FALSE; /* set true if we need to retry, see below */

    int32_t langi = 0; /* index of the language substitution (0 or 1), virtually always 0 */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    {
        UErrorCode status = U_ZERO_ERROR;
        UResourceBundle* locbundle=ures_open(U_ICUDATA_LANG, displayLocale, &status);
        UResourceBundle* dspbundle=ures_getByKeyWithFallback(locbundle, _kLocaleDisplayPattern,
                                                             NULL, &status);

        separator=ures_getStringByKeyWithFallback(dspbundle, _kSeparator, &sepLen, &status);
        pattern=ures_getStringByKeyWithFallback(dspbundle, _kPattern, &patLen, &status);

        ures_close(dspbundle);
        ures_close(locbundle);
    }

    /* If we couldn't find any data, then use the defaults */
    if(sepLen == 0) {
       separator = defaultSeparator;
    }
    /* #10244: Even though separator is now a pattern, it is awkward to handle it as such
     * here since we are trying to build the display string in place in the dest buffer,
     * and to handle it as a pattern would entail having separate storage for the
     * substrings that need to be combined (the first of which may be the result of
     * previous such combinations). So for now we continue to treat the portion between
     * {0} and {1} as a string to be appended when joining substrings, ignoring anything
     * that is before {0} or after {1} (no existing separator pattern has any such thing).
     * This is similar to how pattern is handled below.
     */
    {
        UChar *p0=u_strstr(separator, sub0);
        UChar *p1=u_strstr(separator, sub1);
        if (p0==NULL || p1==NULL || p1<p0) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        separator = (const UChar *)p0 + subLen;
        sepLen = static_cast<int32_t>(p1 - separator);
    }

    if(patLen==0 || (patLen==defaultPatLen && !u_strncmp(pattern, defaultPattern, patLen))) {
        pattern=defaultPattern;
        patLen=defaultPatLen;
        sub0Pos=defaultSub0Pos;
        sub1Pos=defaultSub1Pos;
        // use default formatOpenParen etc. set above
    } else { /* non-default pattern */
        UChar *p0=u_strstr(pattern, sub0);
        UChar *p1=u_strstr(pattern, sub1);
        if (p0==NULL || p1==NULL) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        sub0Pos = static_cast<int32_t>(p0-pattern);
        sub1Pos = static_cast<int32_t>(p1-pattern);
        if (sub1Pos < sub0Pos) { /* a very odd pattern */
            int32_t t=sub0Pos; sub0Pos=sub1Pos; sub1Pos=t;
            langi=1;
        }
        if (u_strchr(pattern, 0xFF08) != NULL) {
            formatOpenParen         = 0xFF08; // fullwidth (
            formatReplaceOpenParen  = 0xFF3B; // fullwidth [
            formatCloseParen        = 0xFF09; // fullwidth )
            formatReplaceCloseParen = 0xFF3D; // fullwidth ]
        }
    }

    /* We loop here because there is one case in which after the first pass we could need to
     * reextract the data.  If there's initial padding before the first element, we put in
     * the padding and then write that element.  If it turns out there's no second element,
     * we didn't need the padding.  If we do need the data (no preflight), and the first element
     * would have fit but for the padding, we need to reextract.  In this case (only) we
     * adjust the parameters so padding is not added, and repeat.
     */
    do {
        UChar* p=dest;
        int32_t patPos=0; /* position in the pattern, used for non-substitution portions */
        int32_t langLen=0; /* length of language substitution */
        int32_t langPos=0; /* position in output of language substitution */
        int32_t restLen=0; /* length of 'everything else' substitution */
        int32_t restPos=0; /* position in output of 'everything else' substitution */
        UEnumeration* kenum = NULL; /* keyword enumeration */

        /* prefix of pattern, extremely likely to be empty */
        if(sub0Pos) {
            if(destCapacity >= sub0Pos) {
                while (patPos < sub0Pos) {
                    *p++ = pattern[patPos++];
                }
            } else {
                patPos=sub0Pos;
            }
            length=sub0Pos;
        } else {
            length=0;
        }

        for(int32_t subi=0,resti=0;subi<2;) { /* iterate through patterns 0 and 1*/
            UBool subdone = FALSE; /* set true when ready to move to next substitution */

            /* prep p and cap for calls to get display components, pin cap to 0 since
               they complain if cap is negative */
            int32_t cap=destCapacity-length;
            if (cap <= 0) {
                cap=0;
            } else {
                p=dest+length;
            }

            if (subi == langi) { /* {0}*/
                if(haveLang) {
                    langPos=length;
                    langLen=uloc_getDisplayLanguage(locale, displayLocale, p, cap, pErrorCode);
                    length+=langLen;
                    haveLang=langLen>0;
                }
                subdone=TRUE;
            } else { /* {1} */
                if(!haveRest) {
                    subdone=TRUE;
                } else {
                    int32_t len; /* length of component (plus other stuff) we just fetched */
                    switch(resti++) {
                        case 0:
                            restPos=length;
                            len=uloc_getDisplayScriptInContext(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 1:
                            len=uloc_getDisplayCountry(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 2:
                            len=uloc_getDisplayVariant(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 3:
                            kenum = uloc_openKeywords(locale, pErrorCode);
                            U_FALLTHROUGH;
                        default: {
                            const char* kw=uenum_next(kenum, &len, pErrorCode);
                            if (kw == NULL) {
                                uenum_close(kenum);
                                len=0; /* mark that we didn't add a component */
                                subdone=TRUE;
                            } else {
                                /* incorporating this behavior into the loop made it even more complex,
                                   so just special case it here */
                                len = uloc_getDisplayKeyword(kw, displayLocale, p, cap, pErrorCode);
                                if(len) {
                                    if(len < cap) {
                                        p[len]=0x3d; /* '=', assume we'll need it */
                                    }
                                    len+=1;

                                    /* adjust for call to get keyword */
                                    cap-=len;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p+=len;
                                    }
                                }
                                /* reset for call below */
                                if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                                    *pErrorCode=U_ZERO_ERROR;
                                }
                                int32_t vlen = uloc_getDisplayKeywordValue(locale, kw, displayLocale,
                                                                           p, cap, pErrorCode);
                                if(len) {
                                    if(vlen==0) {
                                        --len; /* remove unneeded '=' */
                                    }
                                    /* restore cap and p to what they were at start */
                                    cap=destCapacity-length;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p=dest+length;
                                    }
                                }
                                len+=vlen; /* total we added for key + '=' + value */
                            }
                        } break;
                    } /* end switch */

                    if (len>0) {
                        /* we addeed a component, so add separator and write it if there's room. */
                        if(len+sepLen<=cap) {
                            const UChar * plimit = p + len;
                            for (; p < plimit; p++) {
                                if (*p == formatOpenParen) {
                                    *p = formatReplaceOpenParen;
                                } else if (*p == formatCloseParen) {
                                    *p = formatReplaceCloseParen;
                                }
                            }
                            for(int32_t i=0;i<sepLen;++i) {
                                *p++=separator[i];
                            }
                        }
                        length+=len+sepLen;
                    } else if(subdone) {
                        /* remove separator if we added it */
                        if (length!=restPos) {
                            length-=sepLen;
                        }
                        restLen=length-restPos;
                        haveRest=restLen>0;
                    }
                }
            }

            if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                *pErrorCode=U_ZERO_ERROR;
            }

            if(subdone) {
                if(haveLang && haveRest) {
                    /* append internal portion of pattern, the first time,
                       or last portion of pattern the second time */
                    int32_t padLen;
                    patPos+=subLen;
                    padLen=(subi==0 ? sub1Pos : patLen)-patPos;
                    if(length+padLen < destCapacity) {
                        p=dest+length;
                        for(int32_t i=0;i<padLen;++i) {
                            *p++=pattern[patPos++];
                        }
                    } else {
                        patPos+=padLen;
                    }
                    length+=padLen;
                } else if(subi==0) {
                    /* don't have first component, reset for second component */
                    sub0Pos=0;
                    length=0;
                } else if(length>0) {
                    /* true length is the length of just the component we got. */
                    length=haveLang?langLen:restLen;
                    if(dest && sub0Pos!=0) {
                        if (sub0Pos+length<=destCapacity) {
                            /* first component not at start of result,
                               but we have full component in buffer. */
                            u_memmove(dest, dest+(haveLang?langPos:restPos), length);
                        } else {
                            /* would have fit, but didn't because of pattern prefix. */
                            sub0Pos=0; /* stops initial padding (and a second retry,
                                          so we won't end up here again) */
                            retry=TRUE;
                        }
                    }
                }

                ++subi; /* move on to next substitution */
            }
        }
    } while(retry);

    return u_terminateUChars(dest, destCapacity, length, pErrorCode);
}